

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

QString * __thiscall
QTimeZone::displayName
          (QString *__return_storage_ptr__,QTimeZone *this,QDateTime *atDateTime,NameType nameType,
          QLocale *locale)

{
  QTimeZonePrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  QUtcTimeZonePrivate QStack_a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 3) == 0) {
    if ((pQVar1 != (QTimeZonePrivate *)0x0) && (bVar2 = QTimeZonePrivate::isValid(pQVar1), bVar2)) {
      pQVar1 = (this->d).d;
      qVar4 = QDateTime::toMSecsSinceEpoch(atDateTime);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (*pQVar1->_vptr_QTimeZonePrivate[5])
                  (__return_storage_ptr__,pQVar1,qVar4,(ulong)nameType,locale);
        return __return_storage_ptr__;
      }
      goto LAB_00350494;
    }
LAB_003503ef:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00350494;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    uVar3 = (int)pQVar1 - 1U & 3;
    if (uVar3 - 1 < 2) {
      QUtcTimeZonePrivate::QUtcTimeZonePrivate(&QStack_a8,(qint32)((ulong)pQVar1 >> 2));
      qVar4 = QDateTime::toMSecsSinceEpoch(atDateTime);
      QUtcTimeZonePrivate::displayName(__return_storage_ptr__,&QStack_a8,qVar4,nameType,locale);
      QUtcTimeZonePrivate::~QUtcTimeZonePrivate(&QStack_a8);
    }
    else {
      if (uVar3 == 3) goto LAB_003503ef;
      systemTimeZone();
      displayName(__return_storage_ptr__,(QTimeZone *)&QStack_a8,atDateTime,nameType,locale);
      ~QTimeZone((QTimeZone *)&QStack_a8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00350494:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTimeZone::displayName(const QDateTime &atDateTime, NameType nameType,
                               const QLocale &locale) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().displayName(atDateTime, nameType, locale);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return QUtcTimeZonePrivate(d.s.offset).displayName(
                atDateTime.toMSecsSinceEpoch(), nameType, locale);
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->displayName(atDateTime.toMSecsSinceEpoch(), nameType, locale);
    }

    return QString();
}